

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O2

Barcode * __thiscall
ZXing::Pdf417::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  int iVar1;
  BitMatrixCursor<ZXing::PointT<double>_> topCur;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  SymbolInfo info;
  undefined8 uVar2;
  bool bVar3;
  BitMatrix *this_00;
  ulong uVar4;
  pointer puVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double dVar10;
  int width;
  int height;
  float local_200;
  int top;
  int left;
  uint local_1f4;
  BitMatrixCursor<ZXing::PointT<double>_> local_1f0;
  pointer local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  BinaryBitmap *local_1b0;
  pointer local_1a8;
  int iStack_1a0;
  int iStack_19c;
  pointer local_198;
  undefined8 uStack_190;
  float local_188;
  vector<int,_std::allocator<int>_> codeWords;
  DecoderResult res;
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  PointT<int> local_70;
  PointT<int> local_68;
  PointT<int> local_60;
  undefined8 local_50;
  undefined1 local_48 [16];
  pointer local_38;
  
  uVar6 = *(uint *)(this->super_Reader)._opts;
  if ((uVar6 & 0x10) != 0) {
    this_00 = BinaryBitmap::getBitMatrix(image);
    if (((this_00 == (BitMatrix *)0x0) ||
        (bVar3 = BitMatrix::findBoundingBox(this_00,&left,&top,&width,&height,9), !bVar3)) ||
       (height < 0x33 && width < 0x33)) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_1f4 = (width + left) - 1;
      uVar4 = (ulong)(uint)top;
      local_1b8 = (ulong)(uint)(height + -1 + top);
      local_1f0.p.x = (double)left + 0.5;
      local_1f0.p.y = (double)top + 0.5;
      local_1f0.d.x = 1.0;
      local_1f0.d.y = 0.0;
      local_1c8 = (pointer)0xffffffffffffffff;
      uStack_1c0 = 0xffffffff;
      puVar5 = (pointer)0x0;
      local_200 = 0.0;
      iVar8 = 4;
      iVar9 = 0;
      iVar7 = 0;
      local_1f0.img = this_00;
      local_1b0 = image;
      while( true ) {
        bVar3 = iVar8 == 0;
        iVar8 = iVar8 + -1;
        if (bVar3) break;
        topCur.p.x = local_1f0.p.x;
        topCur.img = local_1f0.img;
        topCur.p.y = local_1f0.p.y;
        topCur.d.x = local_1f0.d.x;
        topCur.d.y = local_1f0.d.y;
        DetectSymbol<ZXing::PointT<double>>
                  ((SymbolInfo *)&res,(Pdf417 *)(ulong)(uint)width,topCur,height,(int)uVar4);
        iVar9 = res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish._4_4_;
        iVar7 = (int)res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
        puVar5 = res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uStack_1c0 = CONCAT44(res._content.encodings.
                              super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                              ._M_impl.super__Vector_impl_data._M_start._4_4_,
                              (int)res._content.encodings.
                                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
        local_1c8 = res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
        local_200 = res._content.encodings.
                    super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                    ._M_impl.super__Vector_impl_data._M_finish._0_4_;
        if (((2 < (int)res._content.bytes.
                       super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish) &&
            (0 < res._content.bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish._4_4_)) &&
           ((int)res._content.encodings.
                 super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                 ._M_impl.super__Vector_impl_data._M_start != -1)) break;
        BitMatrixCursor<ZXing::PointT<double>_>::step(&local_1f0,(double)(width + -1));
        dVar10 = (double)((ulong)local_1f0.d.y ^ (ulong)DAT_0019b280);
        local_1f0.d.y = local_1f0.d.x;
        iVar1 = width;
        width = height;
        height = iVar1;
        local_1f0.d.x = dVar10;
      }
      uVar2 = uStack_1c0;
      if (((iVar7 < 3) || (iVar9 < 1)) || ((int)uStack_1c0 == -1)) {
        memset(__return_storage_ptr__,0,0xd8);
        Result::Result(__return_storage_ptr__);
        image = local_1b0;
      }
      else {
        local_198 = local_1c8;
        uStack_190 = uStack_1c0;
        local_188 = local_200;
        info.nCols = iVar9;
        info.nRows = iVar7;
        topCur_00.p.x = local_1f0.p.x;
        topCur_00.img = local_1f0.img;
        topCur_00.p.y = local_1f0.p.y;
        topCur_00.d.x = local_1f0.d.x;
        topCur_00.d.y = local_1f0.d.y;
        info._0_8_ = puVar5;
        info._16_8_ = local_1c8;
        info.ecLevel = (int)uStack_1c0;
        info.colWidth = uStack_1c0._4_4_;
        info.rowHeight = local_200;
        local_1a8 = puVar5;
        iStack_1a0 = iVar7;
        iStack_19c = iVar9;
        ReadCodeWords<ZXing::PointT<double>>(topCur_00,info);
        DecodeCodewords(&res,&codeWords,2 << ((byte)uVar2 & 0x1f));
        local_50 = 0;
        local_70.y = top;
        local_70.x = local_1f4;
        local_68 = (PointT<int>)((ulong)local_1f4 | local_1b8 << 0x20);
        local_60 = (PointT<int>)(local_1b8 << 0x20 | (ulong)(uint)left);
        local_98 = (undefined1  [16])0x0;
        local_88 = (undefined1  [16])0x0;
        local_48 = (undefined1  [16])0x0;
        local_38 = (pointer)0x0;
        Result::Result(__return_storage_ptr__,&res,(DetectorResult *)local_98,PDF417);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)(local_98 + 8));
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)local_48);
        DecoderResult::~DecoderResult(&res);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&codeWords.super__Vector_base<int,_std::allocator<int>_>);
        image = local_1b0;
      }
    }
    if ((__return_storage_ptr__->_error)._type != Checksum) {
      return __return_storage_ptr__;
    }
    Result::~Result(__return_storage_ptr__);
    uVar6 = *(uint *)(this->super_Reader)._opts;
  }
  DoDecode((Barcodes *)&res,image,false,SUB41((uVar6 & 2) >> 1,0),(bool)((byte)(uVar6 >> 9) & 1));
  FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
            (__return_storage_ptr__,(vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&res);
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)&res);
  return __return_storage_ptr__;
}

Assistant:

Barcode
Reader::decode(const BinaryBitmap& image) const
{
	if (_opts.isPure()) {
		auto res = DecodePure(image);
		if (res.error() != Error::Checksum)
			return res;
		// This falls through and tries the non-pure code path if we have a checksum error. This approach is
		// currently the best option to deal with 'aliased' input like e.g. 03-aliased.png
	}
	
	return FirstOrDefault(DoDecode(image, false, _opts.tryRotate(), _opts.returnErrors()));
}